

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::PathTypeHandlerBase::TryGetFixedProperty<false,true>
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  PropertyIndex index_00;
  PropertyId propId;
  int iVar4;
  TypePath *pTVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  Var aValue;
  byte local_71;
  Var value;
  ObjectSlotAttributes attr;
  ObjectSlotAttributes *attributes;
  PropertyIndex index;
  ScriptContext *requestContext_local;
  FixedPropertyKind propertyType_local;
  Var *pProperty_local;
  PropertyRecord *propertyRecord_local;
  PathTypeHandlerBase *this_local;
  
  bVar2 = FixPropsOnPathTypes();
  if (bVar2) {
    pTVar5 = GetTypePath(this);
    propId = PropertyRecord::GetPropertyId(propertyRecord);
    uVar3 = GetPathLength(this);
    index_00 = TypePath::Lookup(pTVar5,propId,(uint)uVar3);
    if (index_00 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xcec,"(allowNonExistent)",
                                  "Trying to get a fixed function instance for a non-existent property?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      this_local._7_1_ = false;
    }
    else {
      iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
      if (CONCAT44(extraout_var,iVar4) == 0) {
        local_71 = 0;
      }
      else {
        local_71 = *(byte *)(CONCAT44(extraout_var,iVar4) + (ulong)index_00);
      }
      if ((local_71 & 0x18) == 0) {
        pTVar5 = GetTypePath(this);
        uVar3 = GetPathLength(this);
        aValue = TypePath::GetSingletonFixedFieldAt(pTVar5,index_00,(uint)uVar3,requestContext);
        if ((aValue == (Var)0x0) ||
           (((bVar2 = DynamicTypeHandler::IsFixedMethodProperty
                                (&this->super_DynamicTypeHandler,propertyType), !bVar2 ||
             (bVar2 = VarIs<Js::JavascriptFunction>(aValue), !bVar2)) &&
            (bVar2 = DynamicTypeHandler::IsFixedDataProperty
                               (&this->super_DynamicTypeHandler,propertyType), !bVar2)))) {
          this_local._7_1_ = false;
        }
        else {
          *pProperty = aValue;
          pTVar5 = GetTypePath(this);
          uVar3 = GetPathLength(this);
          TypePath::SetIsUsedFixedFieldAt(pTVar5,index_00,(uint)uVar3);
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PathTypeHandlerBase::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, Js::FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        PropertyIndex index = this->GetTypePath()->Lookup(propertyRecord->GetPropertyId(), GetPathLength());
        if (index == Constants::NoSlot)
        {
            AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            return false;
        }

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
        if (attr & (ObjectSlotAttr_Deleted | ObjectSlotAttr_Accessor))
        {
            return false;
        }

        Var value = this->GetTypePath()->GetSingletonFixedFieldAt(index, GetPathLength(), requestContext);
        if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
        {
            *pProperty = value;
            if (markAsUsed)
            {
                this->GetTypePath()->SetIsUsedFixedFieldAt(index, GetPathLength());
            }
            return true;
        }
        else
        {
            return false;
        }
    }